

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void bifpty(bifcxdef *ctx,int argc)

{
  objnum obj;
  runsdef *prVar1;
  runcxdef *prVar2;
  uint uVar3;
  uchar *puVar4;
  anon_union_8_4_1dda36f5_for_runsv aVar5;
  long lStack_40;
  objnum orn;
  runsdef val;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x02') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar1 = prVar2->runcxsp;
  obj = (prVar1->runsv).runsvobj;
  prVar2->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\r') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f4);
  }
  uVar3 = objgetap(prVar2->runcxmem,obj,(prVar2->runcxsp->runsv).runsvprp,&orn,0);
  if (uVar3 == 0) {
    lStack_40 = 5;
  }
  else {
    puVar4 = mcmlck(ctx->bifcxrun->runcxmem,orn);
    aVar5.runsvnum._1_7_ = 0;
    aVar5.runsvnum._0_1_ = puVar4[(ulong)uVar3 + 2];
    val.runsv = aVar5;
    mcmunlck(ctx->bifcxrun->runcxmem,orn);
    if (aVar5.runsvnum != 0xe) goto LAB_00123b68;
    lStack_40 = 7;
  }
  val.runsv.runsvnum = lStack_40;
LAB_00123b68:
  runpush(ctx->bifcxrun,1,&val);
  return;
}

Assistant:

void bifpty(bifcxdef *ctx, int argc)
{
    prpnum   prpn;
    objnum   objn;
    uint     ofs;
    runsdef  val;
    objnum   orn;
    objdef  *objptr;
    prpdef  *propptr;

    bifcntargs(ctx, 2, argc);
    
    /* get offset of obj.prop */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &orn, FALSE);
    
    if (ofs)
    {
        /* lock the object, read the prpdef, and unlock it */
        objptr = (objdef *)mcmlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
        propptr = objofsp(objptr, ofs);
        val.runsv.runsvnum = prptype(propptr);
        mcmunlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
    }
    else
    {
        /* property is not defined by object - indicate that type is nil */
        val.runsv.runsvnum = DAT_NIL;
    }
    
    /* special case:  DAT_DEMAND -> DAT_LIST (for contents properties) */
    if (val.runsv.runsvnum == DAT_DEMAND)
        val.runsv.runsvnum = DAT_LIST;

    /* return the property type as a number */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}